

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  Lexer *pLVar1;
  Dict *pDVar2;
  Bool BVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *node;
  uint code;
  Node **ppNVar6;
  char *property;
  
  if ((list->tag->model & 1) != 0) {
    return;
  }
  pLVar1 = doc->lexer;
  pLVar1->insert = (IStack *)0x0;
  pNVar4 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar4 != (Node *)0x0) {
    do {
      if ((pNVar4->tag == list->tag) && (pNVar4->type == EndTag)) {
        prvTidyFreeNode(doc,pNVar4);
        list->closed = yes;
        return;
      }
      BVar3 = InsertMisc(list,pNVar4);
      if (BVar3 == no) {
        if (pNVar4->type == TextNode) {
LAB_0012acd9:
          if ((pNVar4->tag == (Dict *)0x0) || (pNVar4->tag->id != TidyTag_LI)) {
            prvTidyUngetToken(doc);
            BVar3 = prvTidynodeHasCM(pNVar4,8);
            if ((BVar3 != no) && (pLVar1->excludeBlocks != no)) {
              code = 0xcf;
              goto LAB_0012aeeb;
            }
            if (pLVar1->exiled != no) {
              BVar3 = prvTidynodeHasCM(pNVar4,0x380);
              if (BVar3 != no) {
                return;
              }
              if ((pNVar4->tag != (Dict *)0x0) && (pNVar4->tag->id == TidyTag_TABLE)) {
                return;
              }
            }
            if (((list != (Node *)0x0) && (list->tag != (Dict *)0x0)) &&
               (list->tag->id == TidyTag_OL)) {
              node = (Node *)0x0;
              for (pNVar5 = list->content; pNVar5 != (Node *)0x0; pNVar5 = pNVar5->next) {
                if (((pNVar5->tag != (Dict *)0x0) && (pNVar5->tag->id == TidyTag_LI)) &&
                   (pNVar5->type == StartTag)) {
                  node = pNVar5;
                }
              }
              if (node != (Node *)0x0) {
                pNVar4 = prvTidyInferredTag(doc,TidyTag_LI);
                prvTidyReportError(doc,list,pNVar4,0xd4);
                prvTidyFreeNode(doc,pNVar4);
                goto LAB_0012aebb;
              }
            }
            BVar3 = prvTidynodeHasCM(pNVar4,8);
            node = prvTidyInferredTag(doc,TidyTag_LI);
            property = "list-style: none; display: inline";
            if (BVar3 == no) {
              property = "list-style: none";
            }
            prvTidyAddStyleProperty(doc,node,property);
            prvTidyReportError(doc,list,node,0xd4);
            node->parent = list;
            pNVar4 = list->last;
            node->prev = pNVar4;
            ppNVar6 = &pNVar4->next;
            if (pNVar4 == (Node *)0x0) {
              ppNVar6 = &list->content;
            }
            *ppNVar6 = node;
            list->last = node;
          }
          else {
            pNVar4->parent = list;
            pNVar5 = list->last;
            ppNVar6 = &pNVar5->next;
            if (pNVar5 == (Node *)0x0) {
              ppNVar6 = &list->content;
            }
            pNVar4->prev = pNVar5;
            *ppNVar6 = pNVar4;
            list->last = pNVar4;
            node = pNVar4;
          }
LAB_0012aebb:
          ParseTag(doc,node,IgnoreWhitespace);
        }
        else {
          if (pNVar4->tag == (Dict *)0x0) goto LAB_0012acc1;
          if (pNVar4->type != EndTag) goto LAB_0012acd9;
          if ((pNVar4->tag == (Dict *)0x0) || (pNVar4->tag->id != TidyTag_FORM)) {
            BVar3 = prvTidynodeHasCM(pNVar4,0x10);
            pNVar5 = list;
            if (BVar3 == no) {
              while ((pNVar5 = pNVar5->parent, pNVar5 != (Node *)0x0 &&
                     ((pDVar2 = pNVar5->tag, pDVar2 == (Dict *)0x0 || (pDVar2->id != TidyTag_BODY)))
                     )) {
                if (pNVar4->tag == pDVar2) {
                  prvTidyReportError(doc,list,pNVar4,0xcf);
                  prvTidyUngetToken(doc);
                  return;
                }
              }
              goto LAB_0012acc1;
            }
            prvTidyReportError(doc,list,pNVar4,0xd0);
            prvTidyPopInline(doc,pNVar4);
          }
          else {
            *(byte *)&doc->badForm = (byte)doc->badForm | 1;
LAB_0012acc1:
            prvTidyReportError(doc,list,pNVar4,0xd0);
          }
          prvTidyFreeNode(doc,pNVar4);
        }
      }
      pNVar4 = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (pNVar4 != (Node *)0x0);
  }
  pNVar4 = (Node *)0x0;
  code = 0xce;
LAB_0012aeeb:
  prvTidyReportError(doc,list,pNVar4,code);
  return;
}

Assistant:

void TY_(ParseList)(TidyDocImpl* doc, Node *list, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node, *parent, *lastli;
    Bool wasblock;

    if (list->tag->model & CM_EMPTY)
        return;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (node->type != TextNode && node->tag == NULL)
        {
            TY_(ReportError)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(ReportError)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            if (TY_(nodeHasCM)(node,CM_INLINE))
            {
                TY_(ReportError)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(PopInline)( doc, node );
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = list->parent;
                  parent != NULL; parent = parent->parent )
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1053626. */
                if (nodeIsBODY(parent))
                    break;
                if (node->tag == parent->tag)
                {
                    TY_(ReportError)(doc, list, node, MISSING_ENDTAG_BEFORE);
                    TY_(UngetToken)( doc );
                    return;
                }
            }

            TY_(ReportError)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsLI(node) )
        {
            TY_(UngetToken)( doc );

            if (TY_(nodeHasCM)(node,CM_BLOCK) && lexer->excludeBlocks)
            {
                TY_(ReportError)(doc, list, node, MISSING_ENDTAG_BEFORE);
                return;
            }
            /* http://tidy.sf.net/issue/1316307 */
            /* In exiled mode, return so table processing can continue. */
            else if ( lexer->exiled
                      && (TY_(nodeHasCM)(node, CM_TABLE|CM_ROWGRP|CM_ROW)
                          || nodeIsTABLE(node)) )
                return;

            /* http://tidy.sf.net/issue/836462
               If "list" is an unordered list, insert the next tag within 
               the last <li> to preserve the numbering to match the visual 
               rendering of most browsers. */    
            if ( nodeIsOL(list) && FindLastLI(list, &lastli) )
            {
                /* Create a node for error reporting */
                node = TY_(InferredTag)(doc, TidyTag_LI);
                TY_(ReportError)(doc, list, node, MISSING_STARTTAG );
                TY_(FreeNode)( doc, node);
                node = lastli;
            }
            else
            {
                /* Add an inferred <li> */
                wasblock = TY_(nodeHasCM)(node,CM_BLOCK);
                node = TY_(InferredTag)(doc, TidyTag_LI);
                /* Add "display: inline" to avoid a blank line after <li> with 
                   Internet Explorer. See http://tidy.sf.net/issue/836462 */
                TY_(AddStyleProperty)( doc, node,
                                       wasblock
                                       ? "list-style: none; display: inline"
                                       : "list-style: none" 
                                       );
                TY_(ReportError)(doc, list, node, MISSING_STARTTAG );
                TY_(InsertNodeAtEnd)(list,node);
            }
        }
        else
            /* node is <LI> */
            TY_(InsertNodeAtEnd)(list,node);

        ParseTag( doc, node, IgnoreWhitespace);
    }

    TY_(ReportError)(doc, list, node, MISSING_ENDTAG_FOR);
}